

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trd.c
# Opt level: O2

void trdmain1(errcxdef *ec,int argc,char **argv,appctxdef *appctx,char *save_ext)

{
  char cVar1;
  appctxdef *appctx_00;
  mcmcxdef *mctx;
  int iVar2;
  uint uVar3;
  int iVar4;
  int prv;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  FILE *pFVar11;
  long lVar12;
  osfildef *swapfp;
  mcmcx1def *pmVar13;
  objucxdef *undoctx;
  runsdef *prVar14;
  uchar *puVar15;
  osfildef **ppoVar16;
  uint uVar17;
  ulong max;
  uint uVar18;
  char *swapfilename;
  uint uVar19;
  int local_6d1c;
  int i;
  char *local_6cf0;
  ulong local_6ce8;
  char *local_6ce0;
  char *local_6cd8;
  char **argp;
  uint local_6cc8;
  int local_6cc4;
  int local_6cc0;
  int local_6cbc;
  int local_6cb8;
  int loadopen;
  char *local_6cb0;
  appctxdef *local_6ca8;
  int local_6c9c;
  int local_6c98;
  objnum preinit;
  char *local_6c90;
  objucxdef *local_6c88;
  char *local_6c80;
  char **local_6c78;
  long local_6c70;
  char *local_6c68;
  char *local_6c60;
  uchar *local_6c58;
  ulong local_6c50;
  mcmcx1def *local_6c48;
  mcmcxdef *local_6c40;
  char *local_6c38;
  uint flags;
  runcxdef runctx;
  fiolcxdef fiolctx;
  supcxdef supctx;
  errdef fr_;
  errcxdef *local_69e8;
  runcxdef *local_69e0;
  undefined8 local_69d8;
  undefined8 uStack_69d0;
  undefined1 local_69c8 [176];
  uint local_6918;
  uint local_6914;
  char *local_6910;
  appctxdef *local_6908;
  re_context local_6900;
  _func_void_bifcxdef_ptr_int *bif [100];
  voccxdef vocctx;
  char infile_abs [4096];
  char inbuf [4096];
  char infile_path [4096];
  char swapbuf [4096];
  dbgcxdef local_1340;
  
  loadopen = 0;
  local_6cb8 = argc;
  local_6ca8 = appctx;
  local_6c38 = save_ext;
  out_init();
  argp = argv + 1;
  uVar3 = 0x200;
  uVar5 = 0xffff;
  iVar2 = 60000;
  local_6cf0 = (char *)0x0;
  local_6cbc = 0;
  local_6cc0 = 0;
  max = 0xffffffff;
  local_6ce8 = 0xffffffff;
  uVar17 = 2;
  iVar7 = 1;
  local_6cc4 = 1;
  uVar19 = 2;
  pcVar9 = local_6cf0;
  local_6ce0 = local_6cf0;
  pcVar8 = local_6cf0;
  pcVar10 = local_6cf0;
  local_6c78 = argv;
  while( true ) {
    prv = local_6cbc;
    local_6d1c = local_6cc0;
    uVar18 = (uint)pcVar8;
    uVar6 = (uint)pcVar9;
    i = local_6cc4;
    if ((local_6cb8 <= local_6cc4) || (pcVar8 = *argp, *pcVar8 != '-')) break;
    switch(pcVar8[1]) {
    case 'c':
      local_6cd8 = pcVar10;
      iVar4 = strcmp(pcVar8 + 1,"ctab");
      if (iVar4 != 0) {
        iVar4 = strcmp(pcVar8 + 1,"ctab-");
        uVar18 = 1;
        pcVar10 = local_6cd8;
        goto LAB_001eece6;
      }
      local_6ce0 = cmdarg(ec,&argp,&i,local_6cb8,4,trdusage);
      pcVar10 = local_6cd8;
      break;
    case 'd':
      local_6cd8 = pcVar10;
      iVar4 = strnicmp(pcVar8,"-double",7);
      if (iVar4 == 0) {
        local_6c9c = cmdtog(ec,iVar7,pcVar8,6,trdusage);
        out_set_doublespace(local_6c9c);
        pcVar10 = local_6cd8;
        iVar7 = local_6c9c;
      }
      else {
LAB_001eef1e:
        pcVar10 = local_6cd8;
      }
      break;
    default:
      goto switchD_001ee965_caseD_65;
    case 'i':
      pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      qasopn(pcVar8,1);
      goto LAB_001eee0a;
    case 'l':
      pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      pFVar11 = fopen(pcVar8,"w");
      ppoVar16 = &logfp;
      goto LAB_001eede7;
    case 'm':
      if (pcVar8[2] == 'h') {
        pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,2,trdusage);
        uVar5 = atoi(pcVar8);
        goto LAB_001eee0a;
      }
      if (pcVar8[2] != 's') {
        local_6cd8 = pcVar10;
        pcVar10 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
        max = atol(pcVar10);
        goto LAB_001eef1e;
      }
      local_6cd8 = pcVar10;
      pcVar10 = cmdarg(ec,&argp,&i,local_6cb8,2,trdusage);
      uVar3 = atoi(pcVar10);
      pcVar10 = local_6cd8;
      break;
    case 'n':
      iVar4 = strcmp(pcVar8,"-nobanner");
LAB_001eece6:
      if (iVar4 != 0) goto switchD_001ee965_caseD_65;
      break;
    case 'o':
      pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      pFVar11 = fopen(pcVar8,"w");
      ppoVar16 = &cmdfile;
LAB_001eede7:
      *ppoVar16 = (osfildef *)pFVar11;
      goto LAB_001eee0a;
    case 'p':
      local_6cd8 = pcVar10;
      iVar4 = stricmp(pcVar8,"-plain");
      if (iVar4 == 0) {
        os_plain();
        goto LAB_001eef1e;
      }
      prv = cmdtog(ec,prv,pcVar8,1,trdusage);
      pcVar10 = local_6cd8;
      break;
    case 'r':
      pcVar10 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      goto LAB_001eee0a;
    case 's':
      local_6cc8 = uVar6;
      pcVar9 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      cVar1 = *pcVar9;
      if (cVar1 == 0x3f) goto LAB_001ef7aa;
      uVar19 = (int)cVar1 - 0x30;
      uVar17 = (int)pcVar9[1] - 0x30;
      if (pcVar9[1] == '\0') {
        uVar17 = uVar19;
      }
      if (((byte)(cVar1 - 0x35U) < 0xfb) || (4 < uVar17)) goto LAB_001ef7aa;
      if (local_6ca8 == (appctxdef *)0x0) {
        pcVar9 = (char *)(ulong)local_6cc8;
      }
      else {
        local_6cd8 = pcVar10;
        if (local_6ca8->set_io_safety_level != (_func_void_void_ptr_int_int *)0x0) {
          (*local_6ca8->set_io_safety_level)(local_6ca8->io_safety_level_ctx,uVar19,uVar17);
        }
        pcVar9 = (char *)(ulong)local_6cc8;
        pcVar10 = local_6cd8;
      }
      break;
    case 't':
      cVar1 = pcVar8[2];
      if (cVar1 == 's') {
        pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,2,trdusage);
        local_6ce8 = atol(pcVar8);
      }
      else {
        if (cVar1 != 'p') {
          if (cVar1 == 'f') {
            local_6cd8 = pcVar10;
            local_6cf0 = cmdarg(ec,&argp,&i,local_6cb8,2,trdusage);
            pcVar10 = local_6cd8;
          }
          else {
            local_6cd8 = pcVar10;
            local_6d1c = cmdtog(ec,local_6cc0,pcVar8,1,trdusage);
            pcVar10 = local_6cd8;
          }
          break;
        }
        uVar6 = cmdtog(ec,uVar6,pcVar8,2,trdusage);
        pcVar9 = (char *)(ulong)uVar6;
      }
      goto LAB_001eee0a;
    case 'u':
      pcVar8 = cmdarg(ec,&argp,&i,local_6cb8,1,trdusage);
      iVar2 = atoi(pcVar8);
LAB_001eee0a:
    }
    pcVar8 = (char *)(ulong)uVar18;
    local_6cc0 = local_6d1c;
    argp = argp + 1;
    local_6cc4 = i + 1;
    local_6cbc = prv;
    local_6c98 = iVar7;
    local_6c60 = local_6cf0;
  }
  if (local_6cc4 == local_6cb8) {
    local_6cc8 = uVar6;
    if ((pcVar10 != (char *)0x0) && (iVar7 = fiorso_getgame(pcVar10,inbuf,0x1000), iVar7 != 0))
    goto LAB_001ef124;
    if (local_6c78 == (char **)0x0) {
      local_6c90 = "TRX";
    }
    else {
      local_6c90 = "TRX";
      if (*local_6c78 != (char *)0x0) {
        local_6c90 = *local_6c78;
      }
    }
    pFVar11 = (FILE *)os_exeseek(local_6c90,"TGAM");
    if (pFVar11 != (FILE *)0x0) {
      local_6c70 = ftell(pFVar11);
      local_6c68 = (char *)0x0;
      fseek(pFVar11,0,2);
      lVar12 = ftell(pFVar11);
      fclose(pFVar11);
      pcVar8 = local_6c90;
      pcVar9 = local_6c68;
      if (lVar12 != local_6c70) goto LAB_001ef214;
    }
    if ((local_6ca8 == (appctxdef *)0x0) ||
       (local_6ca8->get_game_name == (_func_int_void_ptr_char_ptr_size_t *)0x0))
    goto switchD_001ee965_caseD_65;
    iVar7 = (*local_6ca8->get_game_name)(local_6ca8->get_game_name_ctx,inbuf,0x1000);
    pcVar8 = local_6c90;
    pcVar9 = inbuf;
    if (iVar7 == 0) {
      trdptf("\n");
      trdptf("(No game has been selected.)\n");
      return;
    }
  }
  else {
    local_6cc8 = uVar6;
    if (local_6cc4 + 1 != local_6cb8) {
switchD_001ee965_caseD_65:
      trdusage(ec);
LAB_001ef7aa:
      trdusage_s(ec);
      goto LAB_001ef7b4;
    }
    pcVar9 = *argp;
    iVar7 = access(pcVar9,0);
    if (iVar7 == 0) {
      pcVar8 = (char *)0x0;
      goto LAB_001ef214;
    }
    strcpy(inbuf,pcVar9);
    os_defext(inbuf,"gam");
LAB_001ef124:
    pcVar8 = (char *)0x0;
    pcVar9 = inbuf;
  }
LAB_001ef214:
  swapfilename = local_6cf0;
  swapfp = (osfildef *)0x0;
  local_6cb0 = pcVar9;
  local_6c80 = pcVar8;
  if ((local_6d1c != 0) && (local_6ce8 != 0)) {
    swapfp = os_create_tempfile(local_6cf0,swapbuf);
    if (swapfilename == (char *)0x0) {
      swapfilename = swapbuf;
    }
    if (swapfp == (osfildef *)0x0) {
      errsigf(ec,"TADS",0xd);
    }
  }
  if (uVar18 == 0) {
    local_6cd8 = pcVar10;
    iVar7 = cmap_load(local_6ce0);
    if (iVar7 != 0) {
      errsigf(ec,"TADS",0x5e3);
    }
  }
  else {
    local_6cd8 = pcVar10;
    cmap_override();
  }
  fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
  if (fr_.errcode == 0) {
    fr_.errprv = ec->errcxptr;
    ec->errcxptr = &fr_;
    pmVar13 = mcmini(max,0x80,local_6ce8,swapfp,swapfilename,ec);
    undoctx = (objucxdef *)0x0;
    local_6c40 = mcmcini(pmVar13,0x80,fioldobj,&fiolctx,objrevert,(void *)0x0);
    local_6c40->mcmcxrvc = local_6c40;
    if ((ushort)iVar2 != 0) {
      undoctx = objuini(local_6c40,(ushort)iVar2,vocdundo,vocdusz,&vocctx);
    }
    local_6c88 = undoctx;
    vocini(&vocctx,ec,local_6c40,&runctx,undoctx,100,100,200);
    main_voc_ctx = &vocctx;
    prVar14 = (runsdef *)mchalo(ec,(ulong)uVar3 * 0x10,"runtime stack");
    local_6c50 = (ulong)uVar5;
    puVar15 = mchalo(ec,local_6c50,"runtime heap");
    pcVar9 = local_6cb0;
    local_6c58 = puVar15;
    local_6c48 = pmVar13;
    if ((local_6cb0 == (char *)0x0) && (pcVar9 = local_6c80, local_6c80 == (char *)0x0)) {
      infile_abs[0] = '\0';
    }
    else {
      os_get_abs_filename(infile_abs,0x1000,pcVar9);
    }
    os_get_path_name(infile_path,0x1000,infile_abs);
    mctx = local_6c40;
    runctx.runcxmem = local_6c40;
    runctx.runcxstop = prVar14 + uVar3;
    runctx.runcxhtop = local_6c58 + local_6c50;
    runctx.runcxundo = local_6c88;
    runctx.runcxbcx = &local_69e8;
    runctx.runcxbi = bif;
    runctx.runcxtio = (tiocxdef *)0x0;
    runctx.runcxdbg = &local_1340;
    runctx.runcxvoc = &vocctx;
    runctx.runcxdmd = supcont;
    runctx.runcxext = (runxdef *)0x0;
    supctx.supcxmem = local_6c40;
    supctx.supcxtab = (tokthdef *)0x0;
    supctx.supcxbuf = (uchar *)0x0;
    runctx.runcxgamename = local_6cb0;
    supctx.supcxlen = 0;
    runctx.runcxgamepath = infile_path;
    local_1340.dbgcxtio = (tiocxdef *)0x0;
    local_1340.dbgcxtab = (tokthdef *)0x0;
    local_1340.dbgcxmem = local_6c40;
    local_1340.dbgcxflg = 0;
    local_1340.dbgcxlin = (lindef *)0x0;
    local_1340.dbgcxfcn = 0;
    local_1340.dbgcxdep = 0;
    runctx.runcxerr = ec;
    runctx.runcxstk = prVar14;
    runctx.runcxsp = prVar14;
    runctx.runcxbp = prVar14;
    runctx.runcxheap = puVar15;
    runctx.runcxhp = puVar15;
    runctx.runcxdmc = &supctx;
    supctx.supcxerr = ec;
    supctx.supcxvoc = runctx.runcxvoc;
    supctx.supcxrun = &runctx;
    local_1340.dbgcxerr = ec;
    memset(local_69c8,0,0x1a0);
    appctx_00 = local_6ca8;
    local_69d8 = 0;
    uStack_69d0 = 0;
    local_6908 = local_6ca8;
    local_6910 = local_6c38;
    local_69e8 = ec;
    local_69e0 = &runctx;
    local_6918 = uVar19;
    local_6914 = uVar17;
    re_init(&local_6900,ec);
    supbif(&supctx,bif,100);
    runistat(&vocctx,&runctx,(tiocxdef *)0x0);
    fiord(mctx,&vocctx,(tokcxdef *)0x0,local_6cb0,local_6c80,&fiolctx,&preinit,&flags,(tokpdef *)0x0
          ,(uchar **)0x0,(uint *)0x0,(uint *)0x0,(uint)(local_6cc8 != 0) * 2,appctx_00,*local_6c78);
    loadopen = 1;
    plygo(&runctx,&vocctx,(tiocxdef *)0x0,preinit,local_6cd8);
    fiorcls(&fiolctx);
    if (prv != 0) {
      trdptf("[press a key to exit]");
      os_waitc();
      trdptf("\n");
    }
    pmVar13 = local_6c48;
    trd_close_swapfile(&runctx);
    qasclose();
    ec->errcxptr = fr_.errprv;
    main_voc_ctx = (voccxdef *)0x0;
    vocterm(&vocctx);
    if (local_6c88 != (objucxdef *)0x0) {
      objuterm(local_6c88);
    }
    mcmcterm(mctx);
    mcmterm(pmVar13);
    return;
  }
LAB_001ef7b4:
  ec->errcxptr = fr_.errprv;
  trd_close_swapfile(&runctx);
  if (loadopen != 0) {
    fiorcls(&fiolctx);
  }
  main_voc_ctx = (voccxdef *)0x0;
  vocterm(&vocctx);
  errrse1(ec,&fr_);
}

Assistant:

static void trdmain1(errcxdef *ec, int argc, char *argv[],
                     appctxdef *appctx, char *save_ext)
{
    osfildef  *swapfp = (osfildef *)0;
    runcxdef   runctx;
    bifcxdef   bifctx;
    voccxdef   vocctx;
    void     (*bif[100])(struct bifcxdef *, int);
    mcmcxdef  *mctx = 0;
    mcmcx1def *globalctx = 0;
    dbgcxdef   dbg;
    supcxdef   supctx;
    char      *swapname = 0;
    char       swapbuf[OSFNMAX];
    char     **argp;
    char      *arg;
    char      *infile;
    char       infile_abs[OSFNMAX];      /* fully-qualified input file name */
    char       infile_path[OSFNMAX];         /* absolute path to input file */
    char      *exefile;            /* try with executable file if no infile */
    ulong      swapsize = 0xffffffffL;        /* allow unlimited swap space */
    int        swapena = OS_DEFAULT_SWAP_ENABLED;      /* swapping enabled? */
    int        i;
    int        pause = FALSE;                 /* pause after finishing game */
    fiolcxdef  fiolctx;
    noreg int  loadopen = FALSE;
    char       inbuf[OSFNMAX];
    ulong      cachelimit = 0xffffffff;
    ushort     undosiz = TRD_UNDOSIZ;      /* default undo context size 16k */
    objucxdef *undoptr = 0;
    uint       flags;         /* flags used to write the file we're reading */
    objnum     preinit;         /* preinit object, if we need to execute it */
    uint       heapsiz = TRD_HEAPSIZ;
    uint       stksiz = TRD_STKSIZ;
    runsdef   *mystack;
    uchar     *myheap;
    extern osfildef *cmdfile;     /* hacky v1 qa interface - command log fp */
    extern osfildef *logfp;        /* hacky v1 qa interface - output log fp */
    int        preload = FALSE;              /* TRUE => preload all objects */
    ulong      totsize;
    extern voccxdef *main_voc_ctx;
    int        safety_read, safety_write;          /* file I/O safety level */
    char      *restore_file = 0;                    /* .SAV file to restore */
    char      *charmap = 0;                           /* character map file */
    int        charmap_none;       /* explicitly do not use a character set */
	int        doublespace = TRUE;        /* formatter double-space setting */
    
    NOREG((&loadopen))

    /* initialize the output formatter */
    out_init();

    /* set safety level to 2 by default - read any/write current dir only */
    safety_read = safety_write = 2;

    /* no -ctab- yet */
    charmap_none = FALSE;

    /* parse arguments */
    for (i = 1, argp = argv + 1 ; i < argc ; ++argp, ++i)
    {
        arg = *argp;
        if (*arg == '-')
        {
            switch(*(arg+1))
            {
            case 'c':
                if (!strcmp(arg+1, "ctab"))
                {
                    /* get the character mapping table */
                    charmap = cmdarg(ec, &argp, &i, argc, 4, trdusage);
                }
                else if (!strcmp(arg+1, "ctab-"))
                {
                    /* use the default mapping */
                    charmap_none = TRUE;
                }
                else
                    trdusage(ec);
                break;
                     
            case 'r':
                /* restore a game */
                restore_file = cmdarg(ec, &argp, &i, argc, 1, trdusage);
                break;
                
            case 'i':
                qasopn(cmdarg(ec, &argp, &i, argc, 1, trdusage), TRUE);
                break;
                
            case 'o':
                cmdfile = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                  OSFTCMD);
                break;
                
            case 'l':
                logfp = osfopwt(cmdarg(ec, &argp, &i, argc, 1, trdusage),
                                OSFTCMD);
                break;

            case 'p':
                if (!stricmp(arg, "-plain"))
                {
                    os_plain();
                    break;
                }
                pause = cmdtog(ec, pause, arg, 1, trdusage);
                break;

            case 'd':
                if (!strnicmp(arg, "-double", 7))
                {
                    /* get the argument value */
                    doublespace = cmdtog(ec, doublespace, arg, 6, trdusage);

                    /* set the double-space mode in the formatter */
                    out_set_doublespace(doublespace);
                    break;
                }
                break;

            case 's':
                {
                    char *p;

                    /* get the option */
                    p = cmdarg(ec, &argp, &i, argc, 1, trdusage);

                    /* if they're asking for help, display detailed usage */
                    if (*p == '?')
                        trdusage_s(ec);

                    /* get the safety level from the argument */
                    safety_read = *p - '0';
                    safety_write = (*(p+1) != '\0' ? *(p+1) - '0' :
                                    safety_read);

                    /* range-check the values */
                    if (safety_read < 0 || safety_read > 4
                        || safety_write < 0 || safety_write > 4)
                        trdusage_s(ec);

                    /* tell the host system about the setting */
                    if (appctx != 0 && appctx->set_io_safety_level != 0)
                        (*appctx->set_io_safety_level)
                            (appctx->io_safety_level_ctx,
                             safety_read, safety_write);
                }
                break;
                
            case 'm':
                switch(*(arg + 2))
                {
                case 's':
                    stksiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'h':
                    heapsiz = atoi(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                default:
                    cachelimit = atol(cmdarg(ec, &argp, &i, argc, 1,
                                             trdusage));
                    break;
                }
				break;

			case 'n':
				/* 
				 *   -nobanner was already parsed and handled by our caller,
				 *   but it's still in the argument list, so just skip it;
				 *   anything else starting with -n is invalid
				 */
				if (strcmp(arg, "-nobanner") != 0)
					trdusage(ec);
				break;

            case 't':
                /* swap file options:  -tf file, -ts size, -t- (no swap) */
                switch(*(arg+2))
                {
                case 'f':
                    swapname = cmdarg(ec, &argp, &i, argc, 2, trdusage);
                    break;
                    
                case 's':
                    swapsize = atol(cmdarg(ec, &argp, &i, argc, 2, trdusage));
                    break;
                    
                case 'p':
                    preload = cmdtog(ec, preload, arg, 2, trdusage);
                    break;
                    
                default:
                    swapena = cmdtog(ec, swapena, arg, 1, trdusage);
                    break;
                }
                break;
                
            case 'u':
                undosiz = atoi(cmdarg(ec, &argp, &i, argc, 1, trdusage));
                break;
                
            default:
                trdusage(ec);
            }
        }
        else break;
    }

    /* presume we won't take the .gam from the application executable */
    exefile = 0;

    /* get input name argument, and make sure it's the last argument */
    if (i == argc)
    {
        osfildef *fp;
        ulong     curpos;
        ulong     endpos;
        int       use_exe;

        /*
         *   There's no input name argument, so we need to find the game
         *   to play some other way.  First, check to see if we have a
         *   game to restore, and if so whether it has the .GAM name
         *   encoded into it.  Next, look to see if there's a game
         *   attached to the executable file; if so, use it.  If not, see
         *   if the host system wants to provide a name through its
         *   callback.  
         */
        
        /* presume we won't find a game attached to the executable file */
        infile = 0;
        use_exe = FALSE;

        /* 
         *   see if we have a saved game to restore, and it specifies the
         *   GAM file that saved it 
         */
        if (restore_file != 0)
        {
            /* try getting the game name from the restore file */
            if (fiorso_getgame(restore_file, inbuf, sizeof(inbuf)))
            {
                /* got it - use this file */
                infile = inbuf;
            }
        }
        
        /* 
         *   it that didn't work, try to read from os-dependent part of
         *   program being executed 
         */
        if (infile == 0)
        {
            /* try opening the executable file */
            exefile = (argv && argv[0] ? argv[0] : "TRX");
            fp = os_exeseek(exefile, "TGAM");
            if (fp != 0)
            {
                /* see if there's a game file attached to the executable */
                curpos = osfpos(fp);
                osfseek(fp, 0L, OSFSK_END);
                endpos = osfpos(fp);
                osfcls(fp);
                
                /* if we found it, use it */
                if (endpos != curpos)
                    use_exe = TRUE;
            }
        }
            
        /* 
         *   if we didn't find a game in the executable, try the host
         *   system callback 
         */
        if (infile == 0 && !use_exe)
        {
            /* 
             *   ask the host system callback what to do - if we don't
             *   have a host system callback, or the callback 
             */
            if (appctx != 0 && appctx->get_game_name != 0)
            {
                /* call the host system callback */
                if ((*appctx->get_game_name)(appctx->get_game_name_ctx,
                                             inbuf, sizeof(inbuf)))
                {
                    /* the host system provided a name - use it */
                    infile = inbuf;
                }
                else
                {
                    /* 
                     *   the host didn't provide a name - simply display a
                     *   message indicating that no game file has been
                     *   chosen, and return 
                     */
                    trdptf("\n");
                    trdptf("(No game has been selected.)\n");
                    return;
                }
            }
            else
            {
                /* 
                 *   we've run out of ways to get a filename - give the
                 *   user the usage message and quit 
                 */
                trdusage(ec);
            }
        }
    }
    else
    {
        infile = *argp;
        if (i + 1 != argc)
            trdusage(ec);

#ifndef OS_HATES_EXTENSIONS
        /*
         *   If original name exists, use it; otherwise, try adding .GAM.
         *   Note that this code is ifdef'd so that platforms that don't
         *   use filename extensions in the manner conventional for DOS
         *   and Unix won't use this code. 
         */
        if (osfacc(infile))
        {
            strcpy(inbuf, infile);
            os_defext(inbuf, "gam");
            infile = inbuf;
        }
#endif /* !defined(OS_HATES_EXTENSIONS) */
    }
    
    /* open up the swap file */
    if (swapena && swapsize)
    {
        swapfp = os_create_tempfile(swapname, swapbuf);
        if (swapname == 0) swapname = swapbuf;
        if (swapfp == 0) errsig(ec, ERR_OPSWAP);
    }
    
    /* load the character map */
    if (charmap_none)
        cmap_override();
    else if (cmap_load(charmap))
        errsig(ec, ERR_INVCMAP);

    ERRBEGIN(ec)

    /* initialize cache manager context */
    globalctx = mcmini(cachelimit, 128, swapsize, swapfp, swapname, ec);
    mctx = mcmcini(globalctx, 128, fioldobj, &fiolctx,
                   objrevert, (void *)0);
    mctx->mcmcxrvc = mctx;

    /* set up an undo context */
    if (undosiz)
        undoptr = objuini(mctx, undosiz, vocdundo, vocdusz, &vocctx);
    else
        undoptr = (objucxdef *)0;

    /* set up vocabulary context */
    vocini(&vocctx, ec, mctx, &runctx, undoptr, 100, 100, 200);

    /*
     *   save a pointer to the voc context globally, so that certain
     *   external routines (such as Unix-style signal handlers) can reach
     *   it 
     */
    main_voc_ctx = &vocctx;
    
    /* allocate stack and heap */
    totsize = (ulong)stksiz * (ulong)sizeof(runsdef);
    if (totsize != (size_t)totsize)
        errsig1(ec, ERR_STKSIZE, ERRTINT, (uint)(65535/sizeof(runsdef)));
    mystack = (runsdef *)mchalo(ec, (size_t)totsize, "runtime stack");
    myheap = mchalo(ec, heapsiz, "runtime heap");

    /* get the absolute path for the input file */
    if (infile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), infile);
    else if (exefile != 0)
        os_get_abs_filename(infile_abs, sizeof(infile_abs), exefile);
    else
        infile_abs[0] = '\0';
    os_get_path_name(infile_path, sizeof(infile_path), infile_abs);

    /* set up execution context */
    runctx.runcxerr = ec;
    runctx.runcxmem = mctx;
    runctx.runcxstk = mystack;
    runctx.runcxstop = &mystack[stksiz];
    runctx.runcxsp = mystack;
    runctx.runcxbp = mystack;
    runctx.runcxheap = myheap;
    runctx.runcxhp = myheap;
    runctx.runcxhtop = &myheap[heapsiz];
    runctx.runcxundo = undoptr;
    runctx.runcxbcx = &bifctx;
    runctx.runcxbi = bif;
    runctx.runcxtio = (tiocxdef *)0;
    runctx.runcxdbg = &dbg;
    runctx.runcxvoc = &vocctx;
    runctx.runcxdmd = supcont;
    runctx.runcxdmc = &supctx;
    runctx.runcxext = 0;
    runctx.runcxgamename = infile;
    runctx.runcxgamepath = infile_path;

    /* set up setup context */
    supctx.supcxerr = ec;
    supctx.supcxmem = mctx;
    supctx.supcxtab = (tokthdef *)0;
    supctx.supcxbuf = (uchar *)0;
    supctx.supcxlen = 0;
    supctx.supcxvoc = &vocctx;
    supctx.supcxrun = &runctx;
    
    /* set up debug context */
    dbg.dbgcxtio = (tiocxdef *)0;
    dbg.dbgcxmem = mctx;
    dbg.dbgcxerr = ec;
    dbg.dbgcxtab = (tokthdef *)0;
    dbg.dbgcxfcn = 0;
    dbg.dbgcxdep = 0;
    dbg.dbgcxflg = 0;
    dbg.dbgcxlin = (lindef *)0;                      /* no line sources yet */
    
    /* set up built-in function context */
    CLRSTRUCT(bifctx);
    bifctx.bifcxerr = ec;
    bifctx.bifcxrun = &runctx;
    bifctx.bifcxtio = (tiocxdef *)0;
    bifctx.bifcxrnd = 0;
    bifctx.bifcxrndset = FALSE;
    bifctx.bifcxappctx = appctx;
    bifctx.bifcxsafetyr = safety_read;
    bifctx.bifcxsafetyw = safety_write;
    bifctx.bifcxsavext = save_ext;

    /* initialize the regular expression parser context */
    re_init(&bifctx.bifcxregex, ec);
    
    /* add the built-in functions, keywords, etc */
    supbif(&supctx, bif, (int)(sizeof(bif)/sizeof(bif[0])));
    
    /* set up status line hack */
    runistat(&vocctx, &runctx, (tiocxdef *)0);

    /* turn on the "busy" cursor before loading */
    os_csr_busy(TRUE);
    
    /* read the game from the binary file */
    fiord(mctx, &vocctx, (struct tokcxdef *)0,
          infile, exefile, &fiolctx, &preinit, &flags,
          (struct tokpdef *)0, (uchar **)0, (uint *)0, (uint *)0,
          (preload ? 2 : 0), appctx, argv[0]);
    loadopen = TRUE;

    /* turn off the "busy" cursor */
    os_csr_busy(FALSE);
    
    /* play the game */
    plygo(&runctx, &vocctx, (tiocxdef *)0, preinit, restore_file);
    
    /* close load file */
    fiorcls(&fiolctx);
    
    if (pause)
    {
        trdptf("[press a key to exit]");
        os_waitc();
        trdptf("\n");
    }
    
    /* close and delete swapfile, if one was opened */
    trd_close_swapfile(&runctx);

    /* make sure the script file is closed, if we have one */
    qasclose();

    ERRCLEAN(ec)
        /* close and delete swapfile, if one was opened */
        trd_close_swapfile(&runctx);
        
        /* close the load file if one was opened */
        if (loadopen)
            fiorcls(&fiolctx);

        /* vocctx is going out of scope - forget the global reference to it */
        main_voc_ctx = 0;

        /* delete the voc context */
        vocterm(&vocctx);

        /* delete the undo context */
        if (undoptr != 0)
            objuterm(undoptr);

        /* release the object cache structures */
        if (mctx != 0)
            mcmcterm(mctx);
        if (globalctx != 0)
            mcmterm(globalctx);
    ERRENDCLN(ec)

    /* vocctx is going out of scope - forget the global reference to it */
    main_voc_ctx = 0;

    /* delete the voc contxt */
    vocterm(&vocctx);

    /* delete the undo context */
    if (undoptr != 0)
        objuterm(undoptr);

    /* release the object cache structures */
    mcmcterm(mctx);
    mcmterm(globalctx);
}